

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ini_file::load_include(xr_ini_file *this,char *path)

{
  bool bVar1;
  char *p_00;
  size_t sVar2;
  bool status;
  char *p;
  xr_reader *r;
  xr_file_system *fs;
  char *path_local;
  xr_ini_file *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  p = (char *)xr_file_system::r_open((xr_file_system *)r,(char *)fs);
  if ((xr_reader *)p == (xr_reader *)0x0) {
    msg("can\'t include %s",fs);
    this_local._7_1_ = false;
  }
  else {
    p_00 = xr_reader::pointer<char_const>((xr_reader *)p);
    sVar2 = xr_reader::size((xr_reader *)p);
    bVar1 = parse(this,p_00,p_00 + sVar2,(char *)fs);
    xr_file_system::r_close((xr_file_system *)r,(xr_reader **)&p);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      msg("can\'t parse %s",fs);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ini_file::load_include(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0) {
		msg("can't include %s", path);
		return false;
	}
	const char* p = r->pointer<const char>();
	bool status = parse(p, p + r->size(), path);
	fs.r_close(r);
	if (status)
		return true;
	msg("can't parse %s", path);
	return false;
}